

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void arb1_texld(Context *ctx,char *opcode,int texldd)

{
  uint uVar1;
  int *piVar2;
  byte bVar3;
  uint uVar4;
  undefined4 in_register_00000014;
  char *pcVar5;
  RegisterList *item;
  RegisterList *pRVar6;
  uint uVar7;
  char src3 [64];
  char src2 [64];
  char src0 [64];
  char dst [64];
  int *buflen;
  
  uVar7 = (ctx->dest_arg).result_mod;
  if (((uVar7 & 2) != 0) && (ctx->profile_supports_nv4 != 0)) {
    (ctx->dest_arg).result_mod = uVar7 & 0xfffffffd;
  }
  make_ARB1_destarg_string(ctx,dst,CONCAT44(in_register_00000014,texldd));
  bVar3 = ctx->minor_ver;
  if (bVar3 == 0xff) {
    bVar3 = 0;
  }
  uVar7 = (uint)bVar3 | (uint)ctx->major_ver << 0x10;
  buflen = &(ctx->dest_arg).regnum;
  piVar2 = &ctx->source_args[1].regnum;
  if (uVar7 < 0x10004) {
    piVar2 = buflen;
  }
  uVar1 = *piVar2;
  pRVar6 = (ctx->samplers).next;
  if (pRVar6 != (RegisterList *)0x0) {
    do {
      uVar4 = pRVar6->regtype << 0x10 | pRVar6->regnum;
      buflen = (int *)(ulong)uVar4;
      if ((uVar1 | 0xa0000) == uVar4) goto LAB_001236c0;
    } while ((uVar4 <= (uVar1 | 0xa0000)) && (pRVar6 = pRVar6->next, pRVar6 != (RegisterList *)0x0))
    ;
  }
  pRVar6 = (RegisterList *)0x0;
LAB_001236c0:
  if (uVar7 < 0x10004) {
    get_ARB1_destarg_varname(ctx,src0,0);
  }
  else {
    get_ARB1_srcarg_varname(ctx,0,src0,(size_t)buflen);
  }
  src2[0x30] = '\0';
  src2[0x31] = '\0';
  src2[0x32] = '\0';
  src2[0x33] = '\0';
  src2[0x34] = '\0';
  src2[0x35] = '\0';
  src2[0x36] = '\0';
  src2[0x37] = '\0';
  src2[0x38] = '\0';
  src2[0x39] = '\0';
  src2[0x3a] = '\0';
  src2[0x3b] = '\0';
  src2[0x3c] = '\0';
  src2[0x3d] = '\0';
  src2[0x3e] = '\0';
  src2[0x3f] = '\0';
  src2[0x20] = '\0';
  src2[0x21] = '\0';
  src2[0x22] = '\0';
  src2[0x23] = '\0';
  src2[0x24] = '\0';
  src2[0x25] = '\0';
  src2[0x26] = '\0';
  src2[0x27] = '\0';
  src2[0x28] = '\0';
  src2[0x29] = '\0';
  src2[0x2a] = '\0';
  src2[0x2b] = '\0';
  src2[0x2c] = '\0';
  src2[0x2d] = '\0';
  src2[0x2e] = '\0';
  src2[0x2f] = '\0';
  src2[0x10] = '\0';
  src2[0x11] = '\0';
  src2[0x12] = '\0';
  src2[0x13] = '\0';
  src2[0x14] = '\0';
  src2[0x15] = '\0';
  src2[0x16] = '\0';
  src2[0x17] = '\0';
  src2[0x18] = '\0';
  src2[0x19] = '\0';
  src2[0x1a] = '\0';
  src2[0x1b] = '\0';
  src2[0x1c] = '\0';
  src2[0x1d] = '\0';
  src2[0x1e] = '\0';
  src2[0x1f] = '\0';
  src2[0] = '\0';
  src2[1] = '\0';
  src2[2] = '\0';
  src2[3] = '\0';
  src2[4] = '\0';
  src2[5] = '\0';
  src2[6] = '\0';
  src2[7] = '\0';
  src2[8] = '\0';
  src2[9] = '\0';
  src2[10] = '\0';
  src2[0xb] = '\0';
  src2[0xc] = '\0';
  src2[0xd] = '\0';
  src2[0xe] = '\0';
  src2[0xf] = '\0';
  src3[0x30] = '\0';
  src3[0x31] = '\0';
  src3[0x32] = '\0';
  src3[0x33] = '\0';
  src3[0x34] = '\0';
  src3[0x35] = '\0';
  src3[0x36] = '\0';
  src3[0x37] = '\0';
  src3[0x38] = '\0';
  src3[0x39] = '\0';
  src3[0x3a] = '\0';
  src3[0x3b] = '\0';
  src3[0x3c] = '\0';
  src3[0x3d] = '\0';
  src3[0x3e] = '\0';
  src3[0x3f] = '\0';
  src3[0x20] = '\0';
  src3[0x21] = '\0';
  src3[0x22] = '\0';
  src3[0x23] = '\0';
  src3[0x24] = '\0';
  src3[0x25] = '\0';
  src3[0x26] = '\0';
  src3[0x27] = '\0';
  src3[0x28] = '\0';
  src3[0x29] = '\0';
  src3[0x2a] = '\0';
  src3[0x2b] = '\0';
  src3[0x2c] = '\0';
  src3[0x2d] = '\0';
  src3[0x2e] = '\0';
  src3[0x2f] = '\0';
  src3[0x10] = '\0';
  src3[0x11] = '\0';
  src3[0x12] = '\0';
  src3[0x13] = '\0';
  src3[0x14] = '\0';
  src3[0x15] = '\0';
  src3[0x16] = '\0';
  src3[0x17] = '\0';
  src3[0x18] = '\0';
  src3[0x19] = '\0';
  src3[0x1a] = '\0';
  src3[0x1b] = '\0';
  src3[0x1c] = '\0';
  src3[0x1d] = '\0';
  src3[0x1e] = '\0';
  src3[0x1f] = '\0';
  src3[0] = '\0';
  src3[1] = '\0';
  src3[2] = '\0';
  src3[3] = '\0';
  src3[4] = '\0';
  src3[5] = '\0';
  src3[6] = '\0';
  src3[7] = '\0';
  src3[8] = '\0';
  src3[9] = '\0';
  src3[10] = '\0';
  src3[0xb] = '\0';
  src3[0xc] = '\0';
  src3[0xd] = '\0';
  src3[0xe] = '\0';
  src3[0xf] = '\0';
  if (texldd != 0) {
    make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args + 2,src2,(size_t)buflen);
    make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args + 3,src3,(size_t)buflen);
  }
  if (pRVar6 == (RegisterList *)0x0) {
    pcVar5 = "TEXLD using undeclared sampler";
  }
  else {
    if ((0x10003 < uVar7) && (ctx->source_args[1].swizzle != 0xe4)) {
      failf(ctx,"%s","BUG: can\'t handle TEXLD with sampler swizzle at the moment");
    }
    uVar7 = pRVar6->index - 2;
    if (uVar7 < 3) {
      if (texldd != 0) {
        output_line(ctx,"%s%s, %s, %s, %s, texture[%d], %s;",opcode,dst,src0,src2,src3,(ulong)uVar1,
                    *(undefined8 *)(&DAT_0013fd80 + (ulong)uVar7 * 8));
        return;
      }
      output_line(ctx,"%s%s, %s, texture[%d], %s;",opcode,dst,src0,(ulong)uVar1,
                  *(undefined8 *)(&DAT_0013fd80 + (ulong)uVar7 * 8));
      return;
    }
    pcVar5 = "unknown texture type";
  }
  failf(ctx,"%s",pcVar5);
  return;
}

Assistant:

static void arb1_texld(Context *ctx, const char *opcode, const int texldd)
{
    // !!! FIXME: Hack: "TEXH" is invalid in nv4. Fix this more cleanly.
    if ((ctx->dest_arg.result_mod & MOD_PP) && (support_nv4(ctx)))
        ctx->dest_arg.result_mod &= ~MOD_PP;

    char dst[64]; make_ARB1_destarg_string(ctx, dst, sizeof (dst));

    const int sm1 = !shader_version_atleast(ctx, 1, 4);
    const int regnum = sm1 ? ctx->dest_arg.regnum : ctx->source_args[1].regnum;
    RegisterList *sreg = reglist_find(&ctx->samplers, REG_TYPE_SAMPLER, regnum);

    const char *ttype = NULL;
    char src0[64];
    if (sm1)
        get_ARB1_destarg_varname(ctx, src0, sizeof (src0));
    else
        get_ARB1_srcarg_varname(ctx, 0, src0, sizeof (src0));
    //char src1[64]; get_ARB1_srcarg_varname(ctx, 1, src1, sizeof (src1));  // !!! FIXME: SRC_MOD?

    char src2[64] = { 0 };
    char src3[64] = { 0 };

    if (texldd)
    {
        make_ARB1_srcarg_string(ctx, 2, src2, sizeof (src2));
        make_ARB1_srcarg_string(ctx, 3, src3, sizeof (src3));
    } // if

    // !!! FIXME: this should be in state_TEXLD, not in the arb1/glsl emitters.
    if (sreg == NULL)
    {
        fail(ctx, "TEXLD using undeclared sampler");
        return;
    } // if

    // SM1 only specifies dst, so don't check swizzle there.
    if ( !sm1 && (!no_swizzle(ctx->source_args[1].swizzle)) )
    {
        // !!! FIXME: does this ever actually happen?
        fail(ctx, "BUG: can't handle TEXLD with sampler swizzle at the moment");
    } // if

    switch ((const TextureType) sreg->index)
    {
        case TEXTURE_TYPE_2D: ttype = "2D"; break; // !!! FIXME: "RECT"?
        case TEXTURE_TYPE_CUBE: ttype = "CUBE"; break;
        case TEXTURE_TYPE_VOLUME: ttype = "3D"; break;
        default: fail(ctx, "unknown texture type"); return;
    } // switch

    if (texldd)
    {
        output_line(ctx, "%s%s, %s, %s, %s, texture[%d], %s;", opcode, dst,
                    src0, src2, src3, regnum, ttype);
    } // if
    else
    {
        output_line(ctx, "%s%s, %s, texture[%d], %s;", opcode, dst, src0,
                    regnum, ttype);
    } // else
}